

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

IRNode * __thiscall kratos::IfStmt::get_child(IfStmt *this,uint64_t index)

{
  element_type *peVar1;
  
  if (index == 2) {
    peVar1 = (element_type *)
             (this->else_body_).
             super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else if (index == 1) {
    peVar1 = (element_type *)
             (this->then_body_).
             super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else if (index == 0) {
    peVar1 = (this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    peVar1 = (element_type *)0x0;
  }
  return &peVar1->super_IRNode;
}

Assistant:

IRNode *IfStmt::get_child(uint64_t index) {
    if (index == 0)
        return predicate_.get();
    else if (index == 1)
        return then_body_.get();
    else if (index == 2)
        return else_body_.get();
    else
        return nullptr;
}